

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  Colour colourGuard;
  undefined8 uStack_28;
  
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001d2e30 = 0x2d2d2d2d2d2d2d;
    uRam00000000001d2e37._0_1_ = '-';
    uRam00000000001d2e37._1_1_ = '-';
    uRam00000000001d2e37._2_1_ = '-';
    uRam00000000001d2e37._3_1_ = '-';
    uRam00000000001d2e37._4_1_ = '-';
    uRam00000000001d2e37._5_1_ = '-';
    uRam00000000001d2e37._6_1_ = '-';
    uRam00000000001d2e37._7_1_ = '-';
    DAT_001d2e20 = '-';
    DAT_001d2e20_1._0_1_ = '-';
    DAT_001d2e20_1._1_1_ = '-';
    DAT_001d2e20_1._2_1_ = '-';
    DAT_001d2e20_1._3_1_ = '-';
    DAT_001d2e20_1._4_1_ = '-';
    DAT_001d2e20_1._5_1_ = '-';
    DAT_001d2e20_1._6_1_ = '-';
    uRam00000000001d2e28 = 0x2d2d2d2d2d2d2d;
    DAT_001d2e2f = 0x2d;
    DAT_001d2e10 = '-';
    DAT_001d2e10_1._0_1_ = '-';
    DAT_001d2e10_1._1_1_ = '-';
    DAT_001d2e10_1._2_1_ = '-';
    DAT_001d2e10_1._3_1_ = '-';
    DAT_001d2e10_1._4_1_ = '-';
    DAT_001d2e10_1._5_1_ = '-';
    DAT_001d2e10_1._6_1_ = '-';
    uRam00000000001d2e18._0_1_ = '-';
    uRam00000000001d2e18._1_1_ = '-';
    uRam00000000001d2e18._2_1_ = '-';
    uRam00000000001d2e18._3_1_ = '-';
    uRam00000000001d2e18._4_1_ = '-';
    uRam00000000001d2e18._5_1_ = '-';
    uRam00000000001d2e18._6_1_ = '-';
    uRam00000000001d2e18._7_1_ = '-';
    DAT_001d2e00 = '-';
    DAT_001d2e00_1._0_1_ = '-';
    DAT_001d2e00_1._1_1_ = '-';
    DAT_001d2e00_1._2_1_ = '-';
    DAT_001d2e00_1._3_1_ = '-';
    DAT_001d2e00_1._4_1_ = '-';
    DAT_001d2e00_1._5_1_ = '-';
    DAT_001d2e00_1._6_1_ = '-';
    uRam00000000001d2e08._0_1_ = '-';
    uRam00000000001d2e08._1_1_ = '-';
    uRam00000000001d2e08._2_1_ = '-';
    uRam00000000001d2e08._3_1_ = '-';
    uRam00000000001d2e08._4_1_ = '-';
    uRam00000000001d2e08._5_1_ = '-';
    uRam00000000001d2e08._6_1_ = '-';
    uRam00000000001d2e08._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001d2df8._0_1_ = '-';
    uRam00000000001d2df8._1_1_ = '-';
    uRam00000000001d2df8._2_1_ = '-';
    uRam00000000001d2df8._3_1_ = '-';
    uRam00000000001d2df8._4_1_ = '-';
    uRam00000000001d2df8._5_1_ = '-';
    uRam00000000001d2df8._6_1_ = '-';
    uRam00000000001d2df8._7_1_ = '-';
    DAT_001d2e3f = 0;
  }
  uStack_28 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  Colour::Colour((Colour *)((long)&uStack_28 + 6),Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour((Colour *)((long)&uStack_28 + 6));
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}